

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

baseHolder * __thiscall
cs_impl::any::holder<cni_root_namespace::foo_t>::duplicate(holder<cni_root_namespace::foo_t> *this)

{
  holder<cni_root_namespace::foo_t> *phVar1;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<cni_root_namespace::foo_t>,64ul,cs_impl::default_allocator_provider>
           ::alloc<cni_root_namespace::foo_t&>
                     ((allocator_type<cs_impl::any::holder<cni_root_namespace::foo_t>,64ul,cs_impl::default_allocator_provider>
                       *)allocator,(foo_t *)&this->field_0x8);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}